

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Regular::prepareNextState(Regular *this)

{
  prepareNextState((Regular *)
                   ((long)&this[-1].super_StochasticEventGenerator.super_StochasticVariable.
                           super_StochasticProcess.super_Physical.physicalUnit.sUnitSymbol.field_2 +
                   8));
  return;
}

Assistant:

void Regular::prepareNextState()
{
	regularCount--;
	if (!regularCount) {
		stochNextValue += 1.0;
        eventNextValue = true;
		regularCount = regularInterval;
	}
	else
        eventNextValue = false;
	stochNextStateIsPrepared = true;
}